

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBlock_lazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int iVar1;
  U32 UVar2;
  U32 UVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  uint local_4bc;
  uint local_4b8;
  BYTE *local_4a8;
  BYTE *local_498;
  searchMax_f local_488;
  BYTE *local_480;
  BYTE *local_458;
  BYTE *local_448;
  BYTE *local_418;
  BYTE *local_408;
  BYTE *local_3e8;
  BYTE *local_3d8;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  BYTE *repEnd2;
  BYTE *repMatch_3;
  U32 repIndex_3;
  U32 current2;
  size_t litLength;
  BYTE *mStart;
  BYTE *match;
  U32 matchIndex;
  int gain1_5;
  int gain2_5;
  size_t ml2_2;
  size_t offset2_1;
  int gain1_4;
  int gain2_4;
  size_t mlRep_3;
  BYTE *repMatchEnd_2;
  BYTE *repMatch_2;
  int local_2f0;
  U32 repIndex_2;
  int gain1_3;
  int gain2_3;
  size_t mlRep_2;
  int gain1_2;
  int gain2_2;
  size_t ml2_1;
  size_t offset2;
  int gain1_1;
  int gain2_1;
  size_t mlRep_1;
  BYTE *repMatchEnd_1;
  BYTE *repMatch_1;
  int local_2a0;
  U32 repIndex_1;
  int gain1;
  int gain2;
  size_t mlRep;
  size_t ml2;
  size_t offsetFound;
  BYTE *repMatchEnd;
  BYTE *repMatch;
  BYTE *pBStack_268;
  U32 repIndex;
  BYTE *start;
  size_t offset;
  size_t matchLength;
  uint local_248;
  U32 maxRep;
  U32 dictAndPrefixLength;
  U32 dictIndexDelta;
  BYTE *dictEnd;
  BYTE *dictLowest;
  BYTE *dictBase;
  ZSTD_matchState_t *pZStack_220;
  U32 dictLowestIndex;
  ZSTD_matchState_t *dms;
  uint local_210;
  U32 savedOffset;
  U32 offset_2;
  U32 offset_1;
  searchMax_f searchMax;
  BYTE *prefixLowest;
  BYTE *pBStack_1f0;
  U32 prefixLowestIndex;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  int local_1b8;
  undefined4 local_1b4;
  size_t local_1b0;
  void *local_1a8;
  U32 *local_1a0;
  seqStore_t *local_198;
  ZSTD_matchState_t *local_190;
  BYTE *local_188;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  int local_16c;
  BYTE *local_168;
  BYTE *local_160;
  ulong local_158;
  seqStore_t *local_150;
  BYTE *local_148;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  int local_12c;
  BYTE *local_128;
  BYTE *local_120;
  ulong local_118;
  seqStore_t *local_110;
  BYTE *local_108;
  BYTE *litEnd;
  BYTE *litLimit_w;
  int local_ec;
  BYTE *local_e8;
  BYTE *local_e0;
  ulong local_d8;
  seqStore_t *local_d0;
  BYTE *local_c8;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  long local_a0;
  BYTE *local_98;
  BYTE *local_90;
  BYTE *local_88;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  long local_60;
  BYTE *local_58;
  BYTE *local_50;
  BYTE *local_48;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  long local_20;
  BYTE *local_18;
  BYTE *local_10;
  
  local_1b4 = 0;
  local_1b8 = 2;
  istart._4_4_ = 2;
  ilimit = (BYTE *)((long)src + srcSize);
  base = ilimit + -8;
  pBStack_1f0 = (ms->window).base;
  prefixLowest._4_4_ = (ms->window).dictLimit;
  searchMax = (searchMax_f)(pBStack_1f0 + prefixLowest._4_4_);
  _offset_2 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS;
  savedOffset = *rep;
  local_210 = rep[1];
  pZStack_220 = ms->dictMatchState;
  dictBase._4_4_ = (pZStack_220->window).dictLimit;
  dictLowest = (pZStack_220->window).base;
  dictEnd = dictLowest + dictBase._4_4_;
  _dictAndPrefixLength = (pZStack_220->window).nextSrc;
  maxRep = prefixLowest._4_4_ - ((int)_dictAndPrefixLength - (int)dictLowest);
  local_248 = ((int)src - (int)searchMax) + ((int)_dictAndPrefixLength - (int)dictEnd);
  anchor = (BYTE *)((long)src + (long)(int)(uint)(local_248 == 0));
  dms._4_4_ = 0;
  iend = (BYTE *)src;
  ip = (BYTE *)src;
  local_1b0 = srcSize;
  local_1a8 = src;
  local_1a0 = rep;
  local_198 = seqStore;
  local_190 = ms;
  if (local_248 < savedOffset) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417a,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if (local_248 < local_210) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x417b,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  do {
    while( true ) {
      if (base <= anchor) {
        if (savedOffset == 0) {
          local_4b8 = dms._4_4_;
        }
        else {
          local_4b8 = savedOffset;
        }
        *local_1a0 = local_4b8;
        if (local_210 == 0) {
          local_4bc = dms._4_4_;
        }
        else {
          local_4bc = local_210;
        }
        local_1a0[1] = local_4bc;
        return (long)ilimit - (long)iend;
      }
      offset = 0;
      start = (BYTE *)0x0;
      pBStack_268 = anchor + 1;
      if (istart._4_4_ != 2) break;
      repMatch._4_4_ = (((int)anchor - (int)pBStack_1f0) + 1) - savedOffset;
      if (repMatch._4_4_ < prefixLowest._4_4_) {
        local_3d8 = dictLowest + (repMatch._4_4_ - maxRep);
      }
      else {
        local_3d8 = pBStack_1f0 + repMatch._4_4_;
      }
      repMatchEnd = local_3d8;
      if ((prefixLowest._4_4_ - 1) - repMatch._4_4_ < 3) break;
      UVar2 = MEM_read32(local_3d8);
      UVar3 = MEM_read32(anchor + 1);
      if (UVar2 != UVar3) break;
      if (repMatch._4_4_ < prefixLowest._4_4_) {
        local_3e8 = _dictAndPrefixLength;
      }
      else {
        local_3e8 = ilimit;
      }
      offsetFound = (size_t)local_3e8;
      sVar5 = ZSTD_count_2segments(anchor + 5,repMatchEnd + 4,ilimit,local_3e8,(BYTE *)searchMax);
      offset = sVar5 + 4;
      if (local_1b8 != 0) break;
LAB_0019a1b7:
      local_d8 = (long)pBStack_268 - (long)iend;
      litLimit_w = (BYTE *)(offset - 3);
      local_d0 = local_198;
      local_e0 = iend;
      local_e8 = ilimit;
      local_ec = (int)start;
      litEnd = ilimit + -0x20;
      local_108 = iend + local_d8;
      if (local_198->maxNbSeq <=
          (ulong)((long)local_198->sequences - (long)local_198->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2038,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < local_198->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203a,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_198->litStart + local_198->maxNbLit < local_198->lit + local_d8) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (ilimit < iend + local_d8) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203c,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (litEnd < local_108) {
        ZSTD_safecopyLiterals(local_198->lit,iend,local_108,litEnd);
      }
      else {
        ZSTD_copy16(local_198->lit,iend);
        if (0x10 < local_d8) {
          oend = local_d0->lit + 0x10;
          op = local_e0 + 0x10;
          local_a0 = local_d8 - 0x10;
          diff._4_4_ = 0;
          ip_1 = oend + -(long)op;
          local_c8 = oend + local_a0;
          local_98 = op;
          local_90 = oend;
          if ((long)ip_1 < 8 && -0x10 < (long)ip_1) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          if ((long)ip_1 < 0x10 && -0x10 < (long)ip_1) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1270,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(oend,op);
          oend = oend + 0x10;
          op = op + 0x10;
          if (oend < local_c8) {
            do {
              ZSTD_copy16(oend,op);
              oend = oend + 0x10;
              op = op + 0x10;
              ZSTD_copy16(oend,op);
              oend = oend + 0x10;
              op = op + 0x10;
            } while (oend < local_c8);
          }
        }
      }
      local_d0->lit = local_d0->lit + local_d8;
      if (0xffff < local_d8) {
        if (local_d0->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_d0->longLengthID = 1;
        local_d0->longLengthPos =
             (U32)((long)local_d0->sequences - (long)local_d0->sequencesStart >> 3);
      }
      local_d0->sequences->litLength = (U16)local_d8;
      local_d0->sequences->offset = local_ec + 1;
      if ((BYTE *)0xffff < litLimit_w) {
        if (local_d0->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2058,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_d0->longLengthID = 2;
        local_d0->longLengthPos =
             (U32)((long)local_d0->sequences - (long)local_d0->sequencesStart >> 3);
      }
      local_d0->sequences->matchLength = (U16)litLimit_w;
      local_d0->sequences = local_d0->sequences + 1;
      iend = pBStack_268 + offset;
      anchor = iend;
      if (istart._4_4_ == 2) {
        for (; iend = anchor, anchor <= base; anchor = anchor + offset) {
          uVar4 = ((int)anchor - (int)pBStack_1f0) - local_210;
          if ((istart._4_4_ == 2) && (uVar4 < prefixLowest._4_4_)) {
            local_498 = dictLowest + ((ulong)uVar4 - (ulong)maxRep);
          }
          else {
            local_498 = pBStack_1f0 + uVar4;
          }
          if ((prefixLowest._4_4_ - 1) - uVar4 < 3) break;
          UVar2 = MEM_read32(local_498);
          UVar3 = MEM_read32(anchor);
          if (UVar2 != UVar3) break;
          if (uVar4 < prefixLowest._4_4_) {
            local_4a8 = _dictAndPrefixLength;
          }
          else {
            local_4a8 = ilimit;
          }
          sVar5 = ZSTD_count_2segments(anchor + 4,local_498 + 4,ilimit,local_4a8,(BYTE *)searchMax);
          uVar4 = local_210;
          offset = sVar5 + 4;
          start = (BYTE *)(ulong)local_210;
          local_210 = savedOffset;
          savedOffset = uVar4;
          litLimit_w_1 = (BYTE *)(sVar5 + 1);
          local_150 = local_198;
          local_158 = 0;
          local_160 = iend;
          local_168 = ilimit;
          local_16c = 0;
          litEnd_1 = ilimit + -0x20;
          local_188 = iend;
          if (local_198->maxNbSeq <=
              (ulong)((long)local_198->sequences - (long)local_198->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < local_198->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (local_198->litStart + local_198->maxNbLit < local_198->lit) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (ilimit < iend) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (litEnd_1 < iend) {
            ZSTD_safecopyLiterals(local_198->lit,iend,iend,litEnd_1);
          }
          else {
            ZSTD_copy16(local_198->lit,iend);
            if (0x10 < local_158) {
              oend_1 = local_150->lit + 0x10;
              op_1 = local_160 + 0x10;
              local_20 = local_158 - 0x10;
              diff_1._4_4_ = 0;
              ip_2 = oend_1 + -(long)op_1;
              local_48 = oend_1 + local_20;
              local_18 = op_1;
              local_10 = oend_1;
              if ((long)ip_2 < 8 && -0x10 < (long)ip_2) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              if ((long)ip_2 < 0x10 && -0x10 < (long)ip_2) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(oend_1,op_1);
              oend_1 = oend_1 + 0x10;
              op_1 = op_1 + 0x10;
              if (oend_1 < local_48) {
                do {
                  ZSTD_copy16(oend_1,op_1);
                  oend_1 = oend_1 + 0x10;
                  op_1 = op_1 + 0x10;
                  ZSTD_copy16(oend_1,op_1);
                  oend_1 = oend_1 + 0x10;
                  op_1 = op_1 + 0x10;
                } while (oend_1 < local_48);
              }
            }
          }
          local_150->lit = local_150->lit + local_158;
          if (0xffff < local_158) {
            if (local_150->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_150->longLengthID = 1;
            local_150->longLengthPos =
                 (U32)((long)local_150->sequences - (long)local_150->sequencesStart >> 3);
          }
          local_150->sequences->litLength = (U16)local_158;
          local_150->sequences->offset = local_16c + 1;
          if ((BYTE *)0xffff < litLimit_w_1) {
            if (local_150->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_150->longLengthID = 2;
            local_150->longLengthPos =
                 (U32)((long)local_150->sequences - (long)local_150->sequencesStart >> 3);
          }
          local_150->sequences->matchLength = (U16)litLimit_w_1;
          local_150->sequences = local_150->sequences + 1;
        }
      }
      if (istart._4_4_ == 0) {
        while( true ) {
          bVar8 = false;
          if (anchor <= base && local_210 != 0) {
            UVar2 = MEM_read32(anchor);
            UVar3 = MEM_read32(anchor + -(ulong)local_210);
            bVar8 = UVar2 == UVar3;
          }
          if (!bVar8) break;
          sVar5 = ZSTD_count(anchor + 4,anchor + (4 - (ulong)local_210),ilimit);
          uVar4 = local_210;
          offset = sVar5 + 4;
          start = (BYTE *)(ulong)local_210;
          local_210 = savedOffset;
          savedOffset = uVar4;
          litLimit_w_2 = (BYTE *)(sVar5 + 1);
          local_110 = local_198;
          local_118 = 0;
          local_120 = iend;
          local_128 = ilimit;
          local_12c = 0;
          litEnd_2 = ilimit + -0x20;
          local_148 = iend;
          if (local_198->maxNbSeq <=
              (ulong)((long)local_198->sequences - (long)local_198->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < local_198->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (local_198->litStart + local_198->maxNbLit < local_198->lit) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (ilimit < iend) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (litEnd_2 < iend) {
            ZSTD_safecopyLiterals(local_198->lit,iend,iend,litEnd_2);
          }
          else {
            ZSTD_copy16(local_198->lit,iend);
            if (0x10 < local_118) {
              oend_2 = local_110->lit + 0x10;
              op_2 = local_120 + 0x10;
              local_60 = local_118 - 0x10;
              diff_2._4_4_ = 0;
              ip_3 = oend_2 + -(long)op_2;
              local_88 = oend_2 + local_60;
              local_58 = op_2;
              local_50 = oend_2;
              if ((long)ip_3 < 8 && -0x10 < (long)ip_3) {
                __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1268,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              if ((long)ip_3 < 0x10 && -0x10 < (long)ip_3) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(oend_2,op_2);
              oend_2 = oend_2 + 0x10;
              op_2 = op_2 + 0x10;
              if (oend_2 < local_88) {
                do {
                  ZSTD_copy16(oend_2,op_2);
                  oend_2 = oend_2 + 0x10;
                  op_2 = op_2 + 0x10;
                  ZSTD_copy16(oend_2,op_2);
                  oend_2 = oend_2 + 0x10;
                  op_2 = op_2 + 0x10;
                } while (oend_2 < local_88);
              }
            }
          }
          local_110->lit = local_110->lit + local_118;
          if (0xffff < local_118) {
            if (local_110->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x204d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_110->longLengthID = 1;
            local_110->longLengthPos =
                 (U32)((long)local_110->sequences - (long)local_110->sequencesStart >> 3);
          }
          local_110->sequences->litLength = (U16)local_118;
          local_110->sequences->offset = local_12c + 1;
          if ((BYTE *)0xffff < litLimit_w_2) {
            if (local_110->longLengthID != 0) {
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            local_110->longLengthID = 2;
            local_110->longLengthPos =
                 (U32)((long)local_110->sequences - (long)local_110->sequencesStart >> 3);
          }
          local_110->sequences->matchLength = (U16)litLimit_w_2;
          local_110->sequences = local_110->sequences + 1;
          iend = anchor + offset;
          anchor = iend;
        }
      }
    }
    if (istart._4_4_ == 0) {
      bVar8 = savedOffset != 0;
      UVar2 = MEM_read32(anchor + (1 - (ulong)savedOffset));
      UVar3 = MEM_read32(anchor + 1);
      if (bVar8 && UVar2 == UVar3) {
        sVar5 = ZSTD_count(anchor + 5,anchor + (5 - (ulong)savedOffset),ilimit);
        offset = sVar5 + 4;
        if (local_1b8 == 0) goto LAB_0019a1b7;
      }
    }
    ml2 = 999999999;
    mlRep = (*_offset_2)(local_190,anchor,ilimit,&ml2);
    if (offset < mlRep) {
      pBStack_268 = anchor;
      start = (BYTE *)ml2;
      offset = mlRep;
    }
    if (3 < offset) {
      if (local_1b8 != 0) {
        while (anchor < base) {
          anchor = anchor + 1;
          if ((istart._4_4_ == 0) && (start != (BYTE *)0x0)) {
            bVar8 = savedOffset != 0;
            UVar2 = MEM_read32(anchor);
            UVar3 = MEM_read32(anchor + -(ulong)savedOffset);
            if (bVar8 && UVar2 == UVar3) {
              sVar5 = ZSTD_count(anchor + 4,anchor + (4 - (ulong)savedOffset),ilimit);
              _gain1 = sVar5 + 4;
              repIndex_1 = (int)_gain1 * 3;
              iVar1 = (int)offset;
              UVar2 = ZSTD_highbit32((int)start + 1);
              local_2a0 = (iVar1 * 3 - UVar2) + 1;
              if ((3 < _gain1) && (local_2a0 < (int)repIndex_1)) {
                offset = _gain1;
                start = (BYTE *)0x0;
                pBStack_268 = anchor;
              }
            }
          }
          if (istart._4_4_ == 2) {
            repMatch_1._4_4_ = ((int)anchor - (int)pBStack_1f0) - savedOffset;
            if (repMatch_1._4_4_ < prefixLowest._4_4_) {
              local_408 = dictLowest + (repMatch_1._4_4_ - maxRep);
            }
            else {
              local_408 = pBStack_1f0 + repMatch_1._4_4_;
            }
            repMatchEnd_1 = local_408;
            if (2 < (prefixLowest._4_4_ - 1) - repMatch_1._4_4_) {
              UVar2 = MEM_read32(local_408);
              UVar3 = MEM_read32(anchor);
              if (UVar2 == UVar3) {
                if (repMatch_1._4_4_ < prefixLowest._4_4_) {
                  local_418 = _dictAndPrefixLength;
                }
                else {
                  local_418 = ilimit;
                }
                mlRep_1 = (size_t)local_418;
                sVar5 = ZSTD_count_2segments
                                  (anchor + 4,repMatchEnd_1 + 4,ilimit,local_418,(BYTE *)searchMax);
                _gain1_1 = sVar5 + 4;
                offset2._4_4_ = (int)_gain1_1 * 3;
                iVar1 = (int)offset;
                UVar2 = ZSTD_highbit32((int)start + 1);
                offset2._0_4_ = (iVar1 * 3 - UVar2) + 1;
                if ((3 < _gain1_1) && ((int)offset2 < offset2._4_4_)) {
                  offset = _gain1_1;
                  start = (BYTE *)0x0;
                  pBStack_268 = anchor;
                }
              }
            }
          }
          ml2_1 = 999999999;
          _gain1_2 = (*_offset_2)(local_190,anchor,ilimit,&ml2_1);
          lVar6 = _gain1_2 << 2;
          UVar2 = ZSTD_highbit32((int)ml2_1 + 1);
          mlRep_2._4_4_ = (int)lVar6 - UVar2;
          lVar6 = offset << 2;
          UVar2 = ZSTD_highbit32((int)start + 1);
          mlRep_2._0_4_ = ((int)lVar6 - UVar2) + 4;
          if ((_gain1_2 < 4) || (mlRep_2._4_4_ <= (int)mlRep_2)) {
            if ((local_1b8 != 2) || (base <= anchor)) break;
            anchor = anchor + 1;
            if ((istart._4_4_ == 0) && (start != (BYTE *)0x0)) {
              bVar8 = savedOffset != 0;
              UVar2 = MEM_read32(anchor);
              UVar3 = MEM_read32(anchor + -(ulong)savedOffset);
              if (bVar8 && UVar2 == UVar3) {
                sVar5 = ZSTD_count(anchor + 4,anchor + (4 - (ulong)savedOffset),ilimit);
                _gain1_3 = sVar5 + 4;
                repIndex_2 = (int)_gain1_3 * 4;
                lVar6 = offset << 2;
                UVar2 = ZSTD_highbit32((int)start + 1);
                local_2f0 = ((int)lVar6 - UVar2) + 1;
                if ((3 < _gain1_3) && (local_2f0 < (int)repIndex_2)) {
                  offset = _gain1_3;
                  start = (BYTE *)0x0;
                  pBStack_268 = anchor;
                }
              }
            }
            if (istart._4_4_ == 2) {
              repMatch_2._4_4_ = ((int)anchor - (int)pBStack_1f0) - savedOffset;
              if (repMatch_2._4_4_ < prefixLowest._4_4_) {
                local_448 = dictLowest + (repMatch_2._4_4_ - maxRep);
              }
              else {
                local_448 = pBStack_1f0 + repMatch_2._4_4_;
              }
              repMatchEnd_2 = local_448;
              if (2 < (prefixLowest._4_4_ - 1) - repMatch_2._4_4_) {
                UVar2 = MEM_read32(local_448);
                UVar3 = MEM_read32(anchor);
                if (UVar2 == UVar3) {
                  if (repMatch_2._4_4_ < prefixLowest._4_4_) {
                    local_458 = _dictAndPrefixLength;
                  }
                  else {
                    local_458 = ilimit;
                  }
                  mlRep_3 = (size_t)local_458;
                  sVar5 = ZSTD_count_2segments
                                    (anchor + 4,repMatchEnd_2 + 4,ilimit,local_458,(BYTE *)searchMax
                                    );
                  _gain1_4 = sVar5 + 4;
                  offset2_1._4_4_ = (int)_gain1_4 * 4;
                  lVar6 = offset << 2;
                  UVar2 = ZSTD_highbit32((int)start + 1);
                  offset2_1._0_4_ = ((int)lVar6 - UVar2) + 1;
                  if ((3 < _gain1_4) && ((int)offset2_1 < offset2_1._4_4_)) {
                    offset = _gain1_4;
                    start = (BYTE *)0x0;
                    pBStack_268 = anchor;
                  }
                }
              }
            }
            ml2_2 = 999999999;
            uVar7 = (*_offset_2)(local_190,anchor,ilimit,&ml2_2);
            UVar2 = ZSTD_highbit32((int)ml2_2 + 1);
            lVar6 = offset << 2;
            UVar3 = ZSTD_highbit32((int)start + 1);
            if ((uVar7 < 4) || ((int)((int)(uVar7 << 2) - UVar2) <= (int)(((int)lVar6 - UVar3) + 7))
               ) break;
            start = (BYTE *)ml2_2;
            pBStack_268 = anchor;
            offset = uVar7;
          }
          else {
            start = (BYTE *)ml2_1;
            pBStack_268 = anchor;
            offset = _gain1_2;
          }
        }
      }
      if (start != (BYTE *)0x0) {
        if (istart._4_4_ == 0) {
          while( true ) {
            bVar8 = false;
            if (iend < pBStack_268 && searchMax < pBStack_268 + -(long)(start + -2)) {
              bVar8 = pBStack_268[-1] == pBStack_268[-1 - (long)(start + -2)];
            }
            if (!bVar8) break;
            pBStack_268 = pBStack_268 + -1;
            offset = offset + 1;
          }
        }
        if (istart._4_4_ == 2) {
          uVar4 = ((int)pBStack_268 - (int)pBStack_1f0) - ((int)start + -2);
          if (uVar4 < prefixLowest._4_4_) {
            local_480 = dictLowest + ((ulong)uVar4 - (ulong)maxRep);
          }
          else {
            local_480 = pBStack_1f0 + uVar4;
          }
          mStart = local_480;
          if (uVar4 < prefixLowest._4_4_) {
            local_488 = (searchMax_f)dictEnd;
          }
          else {
            local_488 = searchMax;
          }
          while( true ) {
            bVar8 = false;
            if ((iend < pBStack_268) && (bVar8 = false, local_488 < mStart)) {
              bVar8 = pBStack_268[-1] == mStart[-1];
            }
            if (!bVar8) break;
            pBStack_268 = pBStack_268 + -1;
            mStart = mStart + -1;
            offset = offset + 1;
          }
        }
        local_210 = savedOffset;
        savedOffset = (int)start - 2;
      }
      goto LAB_0019a1b7;
    }
    anchor = anchor + ((long)anchor - (long)iend >> 8) + 1;
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2, ZSTD_dictMatchState);
}